

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_parser.h
# Opt level: O0

bool __thiscall
cppcms::impl::multipart_parser::set_content_type(multipart_parser *this,content_type *content_type)

{
  ulong uVar1;
  file *__p;
  undefined4 *in_RDI;
  string bkey;
  string *in_stack_ffffffffffffff38;
  file *this_00;
  __shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *in_stack_ffffffffffffff70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  allocator local_59;
  string local_58 [32];
  string local_38 [55];
  byte local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"boundary",&local_59);
  http::content_type::parameter_by_key
            ((content_type *)in_stack_ffffffffffffff78._M_pi,&in_stack_ffffffffffffff70->name_);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    this_01 = (__shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2> *)
              &stack0xffffffffffffff70;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x16),(string *)this_01);
    std::__cxx11::string::~string((string *)this_01);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x1e),"\r\n\r\n");
    *(undefined8 *)(in_RDI + 0xc) = 2;
    *in_RDI = 0;
    this_00 = (file *)(in_RDI + 2);
    __p = (file *)operator_new(0x450);
    http::file::file((file *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    std::__shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>::reset<cppcms::http::file>
              (this_01,__p);
    std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x393de0);
    http::file::set_temporary_directory(this_00,in_stack_ffffffffffffff38);
    if (in_RDI[0x2e] != -1) {
      std::__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x393e12);
      http::file::set_memory_limit(this_00,(size_t)in_stack_ffffffffffffff38);
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool set_content_type(http::content_type const &content_type)
			{
				std::string bkey = content_type.parameter_by_key("boundary");
				if(bkey.empty())
					return false;
				boundary_ = "\r\n--" + bkey;
				crlfcrlf_ = "\r\n\r\n";
				position_ = 2; // First CRLF does not appear if first state
				state_ = expecting_first_boundary;
				file_.reset(new http::file());
				file_->set_temporary_directory(temp_dir_);
				if(memory_limit_ != -1) {
					file_->set_memory_limit(memory_limit_);
				}
				return true;
			}